

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

void tree_insert(Node *root,int x,int y,int p,int q)

{
  pointer *ppptVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pptVar5;
  iterator __position;
  Node *pptVar6;
  bool bVar7;
  tNode *__dest;
  long lVar8;
  mapped_type *pmVar9;
  long *plVar10;
  Node ptVar11;
  long *plVar12;
  tNode *ptVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  char target;
  Node next;
  string conv_array [12];
  char local_349;
  long local_348;
  tNode *local_340;
  int local_338;
  int local_334;
  string *local_330;
  Node *local_328;
  string *local_320;
  string *local_318;
  tNode *local_310;
  vector<tNode_*,_std::allocator<tNode_*>_> *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  local_348 = CONCAT44(local_348._4_4_,y);
  local_338 = p;
  local_334 = q;
  __dest = (tNode *)operator_new(0x140);
  memcpy(__dest,
         "xxxxxxxxxxxxxxxxxxxxxxxxxxrnbqkbnrxxxxppppppppxxxx        xxxx        xxxx        xxxx        xxxxPPPPPPPPxxxxRNBQKBNRxxxxxxxxxxxxxxxxxxxxxxxxxx"
         ,0x90);
  p_Var2 = &(__dest->materials)._M_t._M_impl.super__Rb_tree_header;
  (__dest->materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar8 = 0;
  (__dest->materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__dest->materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (__dest->materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (__dest->materials)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318 = (string *)&__dest->b_king_pos;
  local_300 = &(__dest->b_king_pos).field_2;
  (__dest->b_king_pos)._M_dataplus._M_p = (pointer)local_300;
  (__dest->b_king_pos)._M_string_length = 0;
  (__dest->b_king_pos).field_2._M_local_buf[0] = '\0';
  local_320 = (string *)&__dest->w_king_pos;
  paVar3 = &(__dest->w_king_pos).field_2;
  (__dest->w_king_pos)._M_dataplus._M_p = (pointer)paVar3;
  (__dest->w_king_pos)._M_string_length = 0;
  (__dest->w_king_pos).field_2._M_local_buf[0] = '\0';
  local_330 = (string *)&__dest->mv;
  paVar4 = &(__dest->mv).field_2;
  (__dest->mv)._M_dataplus._M_p = (pointer)paVar4;
  (__dest->mv)._M_string_length = 0;
  (__dest->mv).field_2._M_local_buf[0] = '\0';
  local_308 = &__dest->next;
  (__dest->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__dest->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__dest->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ptVar11 = *root;
  ptVar13 = __dest;
  do {
    lVar14 = 0;
    do {
      ptVar13->board[0][lVar14] = ptVar11->board[0][lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xc);
    lVar8 = lVar8 + 1;
    ptVar11 = (Node)(ptVar11->board + 1);
    ptVar13 = (tNode *)(ptVar13->board + 1);
  } while (lVar8 != 0xc);
  lVar8 = (long)x;
  lVar15 = (long)(int)local_348;
  lVar16 = (long)local_338;
  lVar14 = (long)local_334;
  local_349 = __dest->board[lVar16][lVar14];
  __dest->board[lVar16][lVar14] = __dest->board[lVar8][lVar15];
  __dest->board[lVar8][lVar15] = ' ';
  local_348 = lVar8;
  local_340 = __dest;
  local_328 = root;
  local_310 = __dest;
  bVar7 = is_repeat(&local_310);
  pptVar6 = local_328;
  if (bVar7) {
    pptVar5 = (local_308->super__Vector_base<tNode_*,_std::allocator<tNode_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar5 != (pointer)0x0) {
      operator_delete(pptVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)local_330 != paVar4) {
      operator_delete(*(undefined1 **)local_330);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)local_320 != paVar3) {
      operator_delete(*(undefined1 **)local_320);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)local_318 != local_300) {
      operator_delete(*(undefined1 **)local_318);
    }
    std::
    _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::~_Rb_tree(&(__dest->materials)._M_t);
    operator_delete(local_340);
    return;
  }
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::operator=(&(__dest->materials)._M_t,&((*local_328)->materials)._M_t);
  if (local_349 != ' ') {
    pmVar9 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](&__dest->materials,&local_349);
    *pmVar9 = *pmVar9 + -1;
  }
  std::__cxx11::string::_M_assign(local_320);
  std::__cxx11::string::_M_assign(local_318);
  local_340->cur_side = (bool)((*pptVar6)->cur_side ^ 1);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"0","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"1","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"2","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"3","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"4","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"5","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"6","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"7","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"8","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"9","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"10","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"11","");
  std::operator+(&local_1f8,"(",&local_1b8 + local_348);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_2f8 = &local_2e8;
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_2e8 = *plVar12;
    lStack_2e0 = plVar10[3];
  }
  else {
    local_2e8 = *plVar12;
    local_2f8 = (long *)*plVar10;
  }
  local_2f0 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_2f8,(ulong)(&local_1b8)[lVar15]._M_dataplus._M_p);
  local_2d8 = &local_2c8;
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_2c8 = *plVar12;
    lStack_2c0 = plVar10[3];
  }
  else {
    local_2c8 = *plVar12;
    local_2d8 = (long *)*plVar10;
  }
  local_2d0 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8 = &local_2a8;
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_2a8 = *plVar12;
    lStack_2a0 = plVar10[3];
  }
  else {
    local_2a8 = *plVar12;
    local_2b8 = (long *)*plVar10;
  }
  local_2b0 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_298 = &local_288;
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_288 = *plVar12;
    lStack_280 = plVar10[3];
  }
  else {
    local_288 = *plVar12;
    local_298 = (long *)*plVar10;
  }
  local_290 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_278 = &local_268;
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_268 = *plVar12;
    lStack_260 = plVar10[3];
  }
  else {
    local_268 = *plVar12;
    local_278 = (long *)*plVar10;
  }
  local_270 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_278,(ulong)(&local_1b8)[lVar16]._M_dataplus._M_p);
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_248 = *plVar12;
    lStack_240 = plVar10[3];
    local_258 = &local_248;
  }
  else {
    local_248 = *plVar12;
    local_258 = (long *)*plVar10;
  }
  local_250 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_228 = *plVar12;
    lStack_220 = plVar10[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar12;
    local_238 = (long *)*plVar10;
  }
  local_230 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_238,(ulong)(&local_1b8)[lVar14]._M_dataplus._M_p);
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_208 = *plVar12;
    lStack_200 = plVar10[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar12;
    local_218 = (long *)*plVar10;
  }
  local_210 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_218);
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_1c8 = *plVar12;
    lStack_1c0 = plVar10[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *plVar12;
    local_1d8 = (long *)*plVar10;
  }
  local_1d0 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::operator=(local_330,(string *)&local_1d8);
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  pptVar6 = local_328;
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  ptVar11 = *pptVar6;
  __position._M_current =
       (ptVar11->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (ptVar11->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<tNode*,std::allocator<tNode*>>::_M_realloc_insert<tNode*const&>
              ((vector<tNode*,std::allocator<tNode*>> *)&ptVar11->next,__position,&local_310);
  }
  else {
    *__position._M_current = local_340;
    ppptVar1 = &(ptVar11->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  lVar8 = 0;
  do {
    if (local_48 + lVar8 != *(undefined1 **)((long)local_58 + lVar8)) {
      operator_delete(*(undefined1 **)((long)local_58 + lVar8));
    }
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x180);
  return;
}

Assistant:

void tree_insert(Node& root, int x, int y, int p, int q){

    Node next = new tNode;

    // Copying the current board state to the new board state
    int a, b;
    for(a=0; a<12; a++){
        for(b=0; b<12; b++){
            next->board[a][b] = root->board[a][b];
        }
    }

    // Moving the piece from (x,y) to (p,q), replacing if needed
    char source = next->board[x][y];
    char target = next->board[p][q];
    next->board[p][q] = source;
    next->board[x][y] = ' ';

    // Checks if this board state has already been examined; skips it if it has been examined
    if(!is_repeat(next)){

        next->materials = root->materials;
        if(' ' != target)
            next->materials[target] -= 1;

        // Copying attributes from old node to new node
        next->w_king_pos = root->w_king_pos;
        next->b_king_pos = root->b_king_pos;
        next->cur_side = !(root->cur_side);

        string conv_array[12] = {"0", "1", "2", "3", "4", "5", "6", "7", "8", "9", "10", "11"};
        next->mv = "(" + conv_array[x] +  "," + conv_array[y] + ")" + "->" + "(" + conv_array[p] +  "," + conv_array[q] + ")";

        root->next.push_back(next);
    }
    else{
        delete next;
    }
}